

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.c
# Opt level: O0

float64 vector_vqgen(float32 **data,int32 rows,int32 cols,int32 vqrows,float64 epsilon,int32 maxiter
                    ,float32 **mean,int32 *map,int32 seed)

{
  int32 iVar1;
  void *pvVar2;
  ulong uVar3;
  undefined1 local_b0 [8];
  ptmr_t tm;
  float32 *gmean;
  int32 *count;
  bitvec_t *sel;
  float64 t;
  float64 prev_sqerr;
  float64 sqerr;
  int32 it;
  int32 r;
  int32 j;
  int32 i;
  float32 **mean_local;
  float64 fStack_28;
  int32 maxiter_local;
  float64 epsilon_local;
  int32 local_18;
  int32 vqrows_local;
  int32 cols_local;
  int32 rows_local;
  float32 **data_local;
  
  t = 0.0;
  _j = mean;
  mean_local._4_4_ = maxiter;
  fStack_28 = epsilon;
  epsilon_local._4_4_ = vqrows;
  local_18 = cols;
  vqrows_local = rows;
  _cols_local = data;
  if (((vqrows <= rows) && (-1 < maxiter)) && (0.0 < (double)epsilon)) {
    pvVar2 = __ckd_calloc__((long)((rows + 0x1f) / 0x20),4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                            ,0x193);
    ptmr_init((ptmr_t *)local_b0);
    ptmr_start((ptmr_t *)local_b0);
    if (seed < 0) {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x19d,"You are using the internal mechanism of vector_vqgen to decide the seed.  \n")
      ;
      uVar3 = time((time_t *)0x0);
      genrand_seed(uVar3 & 0xffffffff);
    }
    else {
      err_msg(ERR_INFO,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
              ,0x1a7,"You are using %d as the seed \n",(ulong)(uint)seed);
      genrand_seed((long)seed);
    }
    for (r = 0; r < epsilon_local._4_4_; r = r + 1) {
      uVar3 = genrand_int31();
      sqerr._4_4_ = (int)((long)(uVar3 & 0x7fffffff) % (long)vqrows_local);
      while (((ulong)*(uint *)((long)pvVar2 + (long)(sqerr._4_4_ / 0x20) * 4) &
             1L << ((byte)sqerr._4_4_ & 0x1f)) != 0) {
        sqerr._4_4_ = sqerr._4_4_ + 1;
        if (vqrows_local <= sqerr._4_4_) {
          sqerr._4_4_ = 0;
        }
      }
      *(uint *)((long)pvVar2 + (long)(sqerr._4_4_ / 0x20) * 4) =
           *(uint *)((long)pvVar2 + (long)(sqerr._4_4_ / 0x20) * 4) |
           (uint)(1L << ((byte)sqerr._4_4_ & 0x1f));
      memcpy(_j[r],_cols_local[sqerr._4_4_],(long)local_18 << 2);
    }
    ckd_free(pvVar2);
    pvVar2 = __ckd_calloc__((long)epsilon_local._4_4_,4,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                            ,0x1bf);
    tm.start_elapsed =
         (float64)__ckd_calloc__((long)local_18,4,
                                 "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                                 ,0x1c2);
    vector_mean((float32 *)tm.start_elapsed,_j,epsilon_local._4_4_,local_18);
    sqerr._0_4_ = 0;
    while( true ) {
      prev_sqerr = 0.0;
      for (r = 0; r < vqrows_local; r = r + 1) {
        iVar1 = vector_vqlabel(_cols_local[r],_j,epsilon_local._4_4_,local_18,(float64 *)&sel);
        map[r] = iVar1;
        prev_sqerr = (float64)((double)sel + (double)prev_sqerr);
      }
      ptmr_stop((ptmr_t *)local_b0);
      if (sqerr._0_4_ == 0) {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x1d0,"Iter %4d: %.1fs CPU; sqerr= %e\n",tm.name,0);
      }
      else {
        err_msg(ERR_INFO,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x1d3,"Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",tm.name,prev_sqerr,
                ((double)t - (double)prev_sqerr) / (double)t,(ulong)sqerr._0_4_);
      }
      if ((((double)prev_sqerr == 0.0) && (!NAN((double)prev_sqerr))) ||
         ((mean_local._4_4_ + -1 <= (int)sqerr._0_4_ ||
          ((0 < (int)sqerr._0_4_ &&
           (((double)t - (double)prev_sqerr) / (double)t < (double)fStack_28)))))) break;
      t = prev_sqerr;
      ptmr_start((ptmr_t *)local_b0);
      for (r = 0; r < epsilon_local._4_4_; r = r + 1) {
        for (it = 0; it < local_18; it = it + 1) {
          _j[r][it] = 0.0;
        }
        *(undefined4 *)((long)pvVar2 + (long)r * 4) = 0;
      }
      for (r = 0; r < vqrows_local; r = r + 1) {
        vector_accum(_j[map[r]],_cols_local[r],local_18);
        *(int *)((long)pvVar2 + (long)map[r] * 4) = *(int *)((long)pvVar2 + (long)map[r] * 4) + 1;
      }
      for (r = 0; r < epsilon_local._4_4_; r = r + 1) {
        if (*(int *)((long)pvVar2 + (long)r * 4) < 2) {
          if (*(int *)((long)pvVar2 + (long)r * 4) == 0) {
            err_msg(ERR_ERROR,
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                    ,0x1ef,"Iter %d: mean[%d] unmapped\n",(ulong)sqerr._0_4_,(ulong)(uint)r);
            memcpy(_j[r],(void *)tm.start_elapsed,(long)local_18 << 2);
          }
        }
        else {
          sel = (bitvec_t *)(1.0 / (double)*(int *)((long)pvVar2 + (long)r * 4));
          for (it = 0; it < local_18; it = it + 1) {
            _j[r][it] = (float32)(float)((double)(float)_j[r][it] * (double)sel);
          }
        }
      }
      sqerr._0_4_ = sqerr._0_4_ + 1;
    }
    ckd_free(pvVar2);
    ckd_free((void *)tm.start_elapsed);
    return prev_sqerr;
  }
  __assert_fail("(rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0)",
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/sphinx3_align/vector.c"
                ,0x191,
                "float64 vector_vqgen(float32 **, int32, int32, int32, float64, int32, float32 **, int32 *, int32)"
               );
}

Assistant:

float64
vector_vqgen(float32 ** data, int32 rows, int32 cols, int32 vqrows,
             float64 epsilon, int32 maxiter,
             float32 ** mean, int32 * map, int32 seed)
{
    int32 i, j, r, it;
    float64 sqerr, prev_sqerr = 0, t;
    bitvec_t *sel;
    int32 *count;
    float32 *gmean;
    ptmr_t tm;

    assert((rows >= vqrows) && (maxiter >= 0) && (epsilon > 0.0));

    sel = bitvec_alloc(rows);

    ptmr_init(&tm);
    ptmr_start(&tm);


    /* Pick a random initial set of centroids */

    if (seed < 0) {
        E_INFO
            ("You are using the internal mechanism of vector_vqgen to decide the seed.  \n");
        s3_rand_seed((unsigned) time(NULL));

    }
    else {

        /*ARCHAN: DON'T delete this line! This will always give the
           experimenter the seed they were using in their experiments. This
           make the result be repeatable */

        E_INFO("You are using %d as the seed \n", seed);
        s3_rand_seed(seed);
    }


    for (i = 0; i < vqrows; i++) {
        /* Find r = a random, previously unselected row from the input */

        r = (s3_rand_int31() & (int32) 0x7fffffff) % rows;

        /*        r = (rand() & (int32)0x7fffffff) % rows; */

        while (bitvec_is_set(sel, r)) { /* BUG: possible infinite loop!! */
            if (++r >= rows)
                r = 0;
        }
        bitvec_set(sel, r);

        memcpy((void *) (mean[i]), (void *) (data[r]),
               cols * sizeof(float32));
        /* BUG: What if two randomly selected rows are identical in content?? */
    }
    bitvec_free(sel);

    count = (int32 *) ckd_calloc(vqrows, sizeof(int32));

    /* In k-means, unmapped means in any iteration are a problem.  Replace them with gmean */
    gmean = (float32 *) ckd_calloc(cols, sizeof(float32));
    vector_mean(gmean, mean, vqrows, cols);

    for (it = 0;; it++) {       /* Iterations of k-means algorithm */
        /* Find the current data->mean mappings (labels) */
        sqerr = 0.0;
        for (i = 0; i < rows; i++) {
            map[i] = vector_vqlabel(data[i], mean, vqrows, cols, &t);
            sqerr += t;
        }
        ptmr_stop(&tm);

        if (it == 0)
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e\n", it, tm.t_cpu,
                   sqerr);
        else
            E_INFO("Iter %4d: %.1fs CPU; sqerr= %e; delta= %e\n",
                   it, tm.t_cpu, sqerr, (prev_sqerr - sqerr) / prev_sqerr);

        /* Check if exit condition satisfied */
        if ((sqerr == 0.0) || (it >= maxiter - 1) ||
            ((it > 0) && (((prev_sqerr - sqerr) / prev_sqerr) < epsilon)))
            break;
        prev_sqerr = sqerr;

        ptmr_start(&tm);

        /* Update (reestimate) means */
        for (i = 0; i < vqrows; i++) {
            for (j = 0; j < cols; j++)
                mean[i][j] = 0.0;
            count[i] = 0;
        }
        for (i = 0; i < rows; i++) {
            vector_accum(mean[map[i]], data[i], cols);
            count[map[i]]++;
        }
        for (i = 0; i < vqrows; i++) {
            if (count[i] > 1) {
                t = 1.0 / (float64) (count[i]);
                for (j = 0; j < cols; j++)
                    /*              mean[i][j] *= t; *//* RAH, compiler was complaining about this,  */
                    mean[i][j] = (float32) ((float64) mean[i][j] * (float64) t);        /*  */
            }
            else if (count[i] == 0) {
                E_ERROR("Iter %d: mean[%d] unmapped\n", it, i);
                memcpy(mean[i], gmean, cols * sizeof(float32));
            }
        }
    }

    ckd_free(count);
    ckd_free(gmean);

    return sqerr;
}